

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finddefault.c
# Opt level: O0

PmDeviceID find_default_device(char *path,int input,PmDeviceID id)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  char *__dest;
  FILE *__stream;
  char local_148 [8];
  char pref_str [256];
  int local_40;
  int offset;
  int i;
  int c;
  FILE *inf;
  char *path_ptr;
  char *full_name;
  char *pref_1;
  PmDeviceID id_local;
  int input_local;
  char *path_local;
  
  pcVar2 = getenv("HOME");
  pref_1._0_4_ = id;
  if (pcVar2 != (char *)0x0) {
    sVar3 = strlen(pcVar2);
    sVar4 = strlen(find_default_device::pref_2);
    sVar5 = strlen(find_default_device::pref_3);
    sVar6 = strlen(path);
    __dest = (char *)malloc(sVar3 + sVar4 + sVar5 + sVar6 + 2);
    strcpy(__dest,pcVar2);
    strcat(__dest,find_default_device::pref_2);
    _id_local = (FILE *)path;
    if (*path == '/') {
      _id_local = (FILE *)(path + 1);
    }
    pcVar2 = strrchr((char *)_id_local,0x2f);
    if (pcVar2 == (char *)0x0) {
      inf = _id_local;
    }
    else {
      inf = (FILE *)(pcVar2 + 1);
      sVar3 = strlen(__dest);
      pref_str._252_4_ = (undefined4)sVar3;
      memcpy(__dest + (int)pref_str._252_4_,_id_local,(long)inf - (long)_id_local);
      __dest[(long)((long)inf + ((long)(int)pref_str._252_4_ - (long)_id_local))] = '\0';
    }
    strcat(__dest,find_default_device::pref_3);
    __stream = fopen(__dest,"r");
    if (__stream != (FILE *)0x0) {
      do {
        do {
          iVar1 = getc(__stream);
          if (iVar1 == -1) {
            return id;
          }
        } while (((iVar1 != 0x22) ||
                 (iVar1 = match_string((FILE *)__stream,(char *)inf), iVar1 == 0)) ||
                (iVar1 = getc(__stream), iVar1 != 0x22));
        iVar1 = match_string((FILE *)__stream,"value");
        if (iVar1 == 0) {
          return id;
        }
        iVar1 = match_string((FILE *)__stream,"=");
        if (iVar1 == 0) {
          return id;
        }
        iVar1 = match_string((FILE *)__stream,"\"");
        if (iVar1 == 0) {
          return id;
        }
        local_40 = 0;
        while ((local_40 < 0x100 && (iVar1 = getc(__stream), iVar1 != 0x22))) {
          local_148[local_40] = (char)iVar1;
          local_40 = local_40 + 1;
        }
      } while (local_40 == 0x100);
      local_148[local_40] = '\0';
      iVar1 = pm_find_default_device(local_148,input);
      pref_1._0_4_ = id;
      if (iVar1 != -1) {
        pref_1._0_4_ = iVar1;
      }
    }
  }
  return (PmDeviceID)pref_1;
}

Assistant:

PmDeviceID find_default_device(char *path, int input, PmDeviceID id)
/* path -- the name of the preference we are searching for
   input -- true iff this is an input device
   id -- current default device id
   returns matching device id if found, otherwise id
*/
{
    static char *pref_2 = "/.java/.userPrefs/";
    static char *pref_3 = "prefs.xml";
    char *pref_1 = getenv("HOME");
    char *full_name, *path_ptr;
    FILE *inf;
    int c, i;
    if (!pref_1) goto nopref; // cannot find preference file
    // full_name will be larger than necessary
    full_name  = malloc(strlen(pref_1) + strlen(pref_2) + strlen(pref_3) +
                        strlen(path) + 2);
    strcpy(full_name, pref_1); 
    strcat(full_name, pref_2);
    // copy all but last path segment to full_name
    if (*path == '/') path++; // skip initial slash in path
    path_ptr = strrchr(path, '/'); 
    if (path_ptr) { // copy up to slash after full_name
        path_ptr++;
        int offset = strlen(full_name);
        memcpy(full_name + offset, path, path_ptr - path);
        full_name[offset + path_ptr - path] = 0; // end of string
    } else {
        path_ptr = path;
    }
    strcat(full_name, pref_3);
    inf = fopen(full_name, "r");
    if (!inf) goto nopref; // cannot open preference file
    // We're not going to build or link in a full XML parser.
    // Instead, find the path string and quoute. Then, look for
    // "value", "=", quote. Then get string up to quote.
    while ((c = getc(inf)) != EOF) {
        char pref_str[STRING_MAX];
        if (c != '"') continue; // scan up to quote
        // look for quote string quote
        if (!match_string(inf, path_ptr)) continue; // path not found
        if (getc(inf) != '"') continue; // path not found, keep scanning
        if (!match_string(inf, "value")) goto nopref; // value not found
        if (!match_string(inf, "=")) goto nopref; // = not found
        if (!match_string(inf, "\"")) goto nopref; // quote not found
        // now read the value up to the close quote
        for (i = 0; i < STRING_MAX; i++) {
            if ((c = getc(inf)) == '"') break;
            pref_str[i] = c;
        }
        if (i == STRING_MAX) continue; // value too long, ignore
        pref_str[i] = 0;
        i = pm_find_default_device(pref_str, input);
        if (i != pmNoDevice) {
            id = i;
	}
        break;
    }
 nopref:
    return id;
}